

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O3

void showTestProgress(int at,int max,int nrTests)

{
  clock_t cVar1;
  
  cVar1 = clock();
  if (cVar1 / 500000 != showTestProgress::prevTick) {
    showTestProgress_cold_1();
  }
  return;
}

Assistant:

static void showTestProgress(int at, int max, int nrTests) {
    static clock_t prevTick = 0;

    // No worries, clock() is a very fast call.
    clock_t tick = clock() / (CLOCKS_PER_SEC / 2);
    if (tick != prevTick) {
        prevTick = tick;

        // Use stderr to not pollute logs.
        fprintf(stderr, "\r%0.1f%% (executed %0.1fM tests)\r", (at * 100.0) / max, nrTests / 1000000.0);
    }
}